

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc_shutdown.c
# Opt level: O1

int main(void)

{
  int line;
  int iVar1;
  int sock;
  long lVar2;
  nn_thread threads [100];
  nn_thread local_988 [100];
  
  line = nn_socket(1,0x20);
  if (line == -1) {
    main_cold_2();
  }
  else {
    iVar1 = nn_bind(line,"inproc://test");
    if (-1 < iVar1) {
      iVar1 = 0;
      do {
        lVar2 = 0;
        do {
          nn_thread_init((nn_thread *)((long)&local_988[0].routine + lVar2),routine,(void *)0x0);
          lVar2 = lVar2 + 0x18;
        } while (lVar2 != 0x960);
        lVar2 = 0;
        do {
          nn_thread_term((nn_thread *)((long)&local_988[0].routine + lVar2));
          lVar2 = lVar2 + 0x18;
        } while (lVar2 != 0x960);
        iVar1 = iVar1 + 1;
      } while (iVar1 != 10);
      test_close_impl((char *)0x44,line,sock);
      return 0;
    }
  }
  main_cold_1();
}

Assistant:

int main ()
{
    int sb;
    int i;
    int j;
    struct nn_thread threads [THREAD_COUNT];

    /*  Stress the shutdown algorithm. */

    sb = test_socket (AF_SP, NN_PUB);
    test_bind (sb, SOCKET_ADDRESS);

    for (j = 0; j != 10; ++j) {
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_init (&threads [i], routine, NULL);
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_term (&threads [i]);
    }

    test_close (sb);

    return 0;
}